

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

vector<chatra::debugger::InstanceState,_std::allocator<chatra::debugger::InstanceState>_> *
__thiscall
chatra::RuntimeImp::getInstancesState
          (vector<chatra::debugger::InstanceState,_std::allocator<chatra::debugger::InstanceState>_>
           *__return_storage_ptr__,RuntimeImp *this)

{
  _Hash_node_base *p_Var1;
  pointer pIVar2;
  vector<chatra::debugger::InstanceState,_std::allocator<chatra::debugger::InstanceState>_> *pvVar3;
  undefined8 *puVar4;
  _Hash_node_base *p_Var5;
  __node_base *p_Var6;
  _Hash_node_base *local_58;
  RuntimeImp *local_50;
  vector<chatra::debugger::InstanceState,_std::allocator<chatra::debugger::InstanceState>_>
  *local_48;
  IdPool<chatra::InstanceId,_chatra::Instance> *local_40;
  pthread_mutex_t *local_38;
  
  local_38 = (pthread_mutex_t *)&this->lockDebugger;
  std::mutex::lock((mutex *)&local_38->__data);
  if (this->paused != false) {
    (__return_storage_ptr__->
    super__Vector_base<chatra::debugger::InstanceState,_std::allocator<chatra::debugger::InstanceState>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<chatra::debugger::InstanceState,_std::allocator<chatra::debugger::InstanceState>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<chatra::debugger::InstanceState,_std::allocator<chatra::debugger::InstanceState>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_40 = &this->instanceIds;
    local_48 = __return_storage_ptr__;
    SpinLock::lock(&local_40->lockValues);
    p_Var6 = &(this->instanceIds).values._M_h._M_before_begin;
    local_50 = this;
    while (pvVar3 = local_48, p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
      p_Var1 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var6 + 2))->_M_max_load_factor;
      if ((p_Var1[1]._M_nxt != (_Hash_node_base *)0x1) &&
         (p_Var1[1]._M_nxt !=
          (_Hash_node_base *)
          (((this->gcInstance)._M_t.
            super___uniq_ptr_impl<chatra::Instance,_std::default_delete<chatra::Instance>_>._M_t.
            super__Tuple_impl<0UL,_chatra::Instance_*,_std::default_delete<chatra::Instance>_>.
            super__Head_base<0UL,_chatra::Instance_*,_false>._M_head_impl)->
          super_IdType<chatra::InstanceId,_chatra::Instance>).id)) {
        std::
        vector<chatra::debugger::InstanceState,_std::allocator<chatra::debugger::InstanceState>_>::
        emplace_back<>(local_48);
        pIVar2 = (pvVar3->
                 super__Vector_base<chatra::debugger::InstanceState,_std::allocator<chatra::debugger::InstanceState>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pIVar2[-1].instanceId = (InstanceId)p_Var1[1]._M_nxt;
        pIVar2[-1].primaryPackageId = (PackageId)p_Var1[2]._M_nxt;
        SpinLock::lock((SpinLock *)(p_Var1 + 3));
        std::vector<chatra::debugger::ThreadId,_std::allocator<chatra::debugger::ThreadId>_>::
        reserve(&pIVar2[-1].threadIds,(size_type)p_Var1[7]._M_nxt);
        p_Var5 = p_Var1 + 6;
        while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
          local_58 = p_Var5[1]._M_nxt;
          std::vector<chatra::debugger::ThreadId,_std::allocator<chatra::debugger::ThreadId>_>::
          emplace_back<chatra::debugger::ThreadId>(&pIVar2[-1].threadIds,(ThreadId *)&local_58);
        }
        (((atomic_flag *)&p_Var1[3]._M_nxt)->super___atomic_flag_base)._M_i = false;
        this = local_50;
      }
    }
    (local_40->lockValues).flag.super___atomic_flag_base._M_i = false;
    pthread_mutex_unlock(local_38);
    return local_48;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x28);
  puVar4[2] = 0;
  puVar4[3] = 0;
  puVar4[4] = 0;
  puVar4[1] = puVar4 + 3;
  *(undefined1 *)(puVar4 + 3) = 0;
  *puVar4 = &PTR__NativeException_0023db08;
  __cxa_throw(puVar4,&debugger::IllegalRuntimeStateException::typeinfo,
              NativeException::~NativeException);
}

Assistant:

std::vector<debugger::InstanceState> RuntimeImp::getInstancesState() {
	CHATRA_CHECK_RUNTIME_PAUSED;

	std::vector<debugger::InstanceState> ret;
	instanceIds.forEach([&](const Instance& instance) {
		auto instanceId = instance.getId();
		if (instanceId == finalizerInstanceId || instanceId == gcInstance->getId())
			return;

		ret.emplace_back();
		auto& v = ret.back();

		v.instanceId = instance.getId();
		v.primaryPackageId = instance.primaryPackageId;

		std::lock_guard<SpinLock> lock1(instance.lockThreads);
		v.threadIds.reserve(instance.threads.size());
		for (auto& e : instance.threads)
			v.threadIds.emplace_back(static_cast<debugger::ThreadId>(static_cast<size_t>(e.first)));
	});
	return ret;
}